

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

string * __thiscall
r_comp::RepliStruct::print_abi_cxx11_(string *__return_storage_ptr__,RepliStruct *this)

{
  pointer psVar1;
  RepliStruct *pRVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  pointer psVar9;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c0;
  _Alloc_hider local_a0;
  size_type local_98;
  char local_90;
  undefined7 uStack_8f;
  undefined1 uStack_88;
  undefined4 uStack_87;
  undefined2 uStack_83;
  char cStack_81;
  string *local_80;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  RepliStruct *local_38;
  
  local_a0._M_p = &local_90;
  local_98 = 0;
  local_90 = '\0';
  switch(this->type) {
  case Root:
    psVar9 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = __return_storage_ptr__;
    if (psVar9 != psVar1) {
      do {
        pRVar2 = (psVar9->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        p_Var3 = (psVar9->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        print_abi_cxx11_(&local_c0,pRVar2);
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar1);
    }
LAB_00121e0b:
    (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
    if (local_a0._M_p == &local_90) {
      (local_80->field_2)._M_allocated_capacity = CONCAT71(uStack_8f,local_90);
      *(ulong *)((long)&local_80->field_2 + 8) =
           CONCAT17(cStack_81,CONCAT25(uStack_83,CONCAT41(uStack_87,uStack_88)));
    }
    else {
      (local_80->_M_dataplus)._M_p = local_a0._M_p;
      (local_80->field_2)._M_allocated_capacity = CONCAT71(uStack_8f,local_90);
    }
    local_80->_M_string_length = local_98;
    __return_storage_ptr__ = local_80;
    break;
  case Structure:
  case Directive:
  case Condition:
  case Development:
    std::__cxx11::string::_M_assign((string *)&local_a0);
    psVar9 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = __return_storage_ptr__;
    local_38 = this;
    if (psVar9 != psVar1) {
      do {
        pRVar2 = (psVar9->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        p_Var3 = (psVar9->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        print_abi_cxx11_(&local_78,pRVar2);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x13f286);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c0.field_2._M_allocated_capacity = *psVar8;
          local_c0.field_2._8_8_ = plVar6[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar8;
          local_c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_c0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar1);
    }
    pRVar2 = local_38;
    __return_storage_ptr__ = local_80;
    if (local_38->type == Structure) {
      local_58[0] = local_48;
      pcVar4 = (local_38->label)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar4,pcVar4 + (local_38->label)._M_string_length);
      __return_storage_ptr__ = local_80;
      std::__cxx11::string::append((char *)local_58);
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_58,(ulong)local_a0._M_p);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78.field_2._8_8_ = puVar7[3];
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_78._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_c0._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)(pRVar2->tail)._M_dataplus._M_p);
    }
    else {
      if (local_38->type != Development) goto LAB_00121e0b;
      local_58[0] = local_48;
      pcVar4 = (local_38->label)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar4,pcVar4 + (local_38->label)._M_string_length);
      std::__cxx11::string::append((char *)local_58);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_58,(ulong)local_a0._M_p);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78.field_2._8_8_ = plVar6[3];
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_78._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_c0._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)(pRVar2->tail)._M_dataplus._M_p);
    }
    goto LAB_00121ff4;
  case Set:
    psVar9 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = __return_storage_ptr__;
    local_38 = this;
    if (psVar9 != psVar1) {
      do {
        print_abi_cxx11_(&local_c0,
                         (psVar9->
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (psVar9 != psVar1 + -1) {
          std::__cxx11::string::append((char *)&local_a0);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar1);
    }
    pRVar2 = local_38;
    local_58[0] = local_48;
    pcVar4 = (local_38->label)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar4,pcVar4 + (local_38->label)._M_string_length);
    std::__cxx11::string::append((char *)local_58);
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_58,(ulong)local_a0._M_p);
    __return_storage_ptr__ = local_80;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_78.field_2._M_allocated_capacity = *psVar8;
      local_78.field_2._8_8_ = puVar7[3];
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar8;
      local_78._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_78._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = puVar7[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_c0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c0,(ulong)(pRVar2->tail)._M_dataplus._M_p);
LAB_00121ff4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar5 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    goto LAB_0012206a;
  case Atom:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (this->cmd)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (this->cmd)._M_string_length);
    goto LAB_0012206a;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_88,uStack_8f);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_87;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_83;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_81;
    __return_storage_ptr__->_M_string_length = 0;
  }
  local_a0._M_p = &local_90;
  local_98 = 0;
  local_90 = '\0';
LAB_0012206a:
  if (local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RepliStruct::print() const
{
    std::string str;

    switch (type) {
    case Atom:
        return cmd;

    case Structure:
    case Development:
    case Directive:
    case Condition:
        str = cmd;

        for (RepliStruct::Ptr arg : args) {
            str += " " + arg->print();
        }

        if (type == Structure) {
            return label + "(" + str + ")" + tail;
        } else if (type == Development) {
            return label + "{" + str + "}" + tail;
        } else {
            return str;
        }

    case Set:
        for (std::vector<RepliStruct::Ptr>::const_iterator iter(args.begin()), last(args.end()), iterEnd(last--); iter != iterEnd; ++iter) {
            str += (*iter)->print();

            if (iter != last) {
                str += " ";
            }
        }

        return label + "[" + str + "]" + tail;

    case Root:
        for (RepliStruct::Ptr arg : args) {
            str += arg->print();
        }

        return str;

    default:
        break;
    }

    return str;
}